

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_extensions.cpp
# Opt level: O0

string * dlib::select_oldest_file(string *filename1,string *filename2)

{
  bool bVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  __rhs;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  file_not_found *anon_var_0_1;
  file_not_found *anon_var_0;
  file f2;
  file f1;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  file *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  string *this;
  file local_b8;
  file local_68;
  string *local_18;
  string *local_10;
  
  this = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  file::file(in_stack_fffffffffffffe50);
  file::file(in_stack_fffffffffffffe50);
  file::file((file *)this,in_stack_fffffffffffffe58);
  file::operator=(in_stack_fffffffffffffe50,
                  (file *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
  file::~file((file *)0x3d2af1);
  file::file((file *)this,in_stack_fffffffffffffe58);
  file::operator=(in_stack_fffffffffffffe50,
                  (file *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
  file::~file((file *)0x3d2be0);
  __rhs = file::last_modified(&local_68);
  file::last_modified(&local_b8);
  bVar1 = std::chrono::operator<
                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)this,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)__rhs.__d.__r);
  if (bVar1) {
    std::__cxx11::string::string(this,local_10);
  }
  else {
    std::__cxx11::string::string(this,local_18);
  }
  file::~file((file *)0x3d2d12);
  file::~file((file *)0x3d2d1f);
  return in_RDI;
}

Assistant:

std::string select_oldest_file (
        const std::string& filename1,
        const std::string& filename2
    )
    {
        file f1, f2;
        try{f1 = file(filename1);} catch(file::file_not_found&) { return filename1; }
        try{f2 = file(filename2);} catch(file::file_not_found&) { return filename2; }

        if (f1.last_modified() < f2.last_modified())
            return filename1;
        else
            return filename2;
    }